

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::Function::display(Function *this,ostream *o)

{
  bool bVar1;
  ostream *poVar2;
  type pIVar3;
  ostream *in_RSI;
  long in_RDI;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
  *v;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  *__range1;
  ostream *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  __normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_40;
  long local_38;
  reference local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  ostream *local_10;
  
  local_18 = in_RDI + 0x40;
  local_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
                *)in_stack_ffffffffffffff88);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
              *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                            *)in_stack_ffffffffffffff90);
    poVar2 = std::operator<<(local_10,(string *)local_30);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator<<(local_10,"\t");
    poVar2 = prelude::operator<<(in_stack_ffffffffffffff90,(Displayable *)in_stack_ffffffffffffff88)
    ;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                  *)in_stack_ffffffffffffff90);
  }
  poVar2 = std::operator<<(local_10,"\t.globl ");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_10,"\t@ ");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 8));
  std::operator<<(poVar2,": ");
  std::__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
            )in_stack_ffffffffffffff90);
  poVar2 = prelude::operator<<(in_stack_ffffffffffffff90,(Displayable *)in_stack_ffffffffffffff88);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_10,(string *)(in_RDI + 8));
  poVar2 = std::operator<<(poVar2,":");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_10,"\t.fnstart");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_38 = in_RDI + 0x28;
  local_40._M_current =
       (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
       std::
       vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                *)in_stack_ffffffffffffff88);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
         *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator*(&local_40);
    bVar1 = std::operator==((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                            in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) {
      poVar2 = std::operator<<(local_10,"!!!nullptr!!!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      pIVar3 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                         ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                          in_stack_ffffffffffffff90);
      if (pIVar3 == (type)0x0) {
        in_stack_ffffffffffffff90 = (ostream *)0x0;
      }
      else {
        in_stack_ffffffffffffff90 =
             (ostream *)__dynamic_cast(pIVar3,&Inst::typeinfo,&LabelInst::typeinfo,0);
      }
      if (in_stack_ffffffffffffff90 == (ostream *)0x0) {
        std::operator<<(local_10,"\t");
      }
      in_stack_ffffffffffffff88 = local_10;
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_ffffffffffffff90
                );
      poVar2 = prelude::operator<<(in_stack_ffffffffffffff90,
                                   (Displayable *)in_stack_ffffffffffffff88);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator++(&local_40);
  }
  poVar2 = std::operator<<(local_10,"\t.fnend");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Function::display(std::ostream &o) const {
  for (auto &v : this->local_const) {
    o << v.first << ":" << std::endl;
    o << "\t" << v.second << std::endl;
  }

  o << "\t.globl " << name << std::endl;

  o << "\t@ " << name << ": " << *ty << std::endl;

  o << name << ":" << std::endl;
  // o << "\t.align 7" << std::endl;
  o << "\t.fnstart" << std::endl;
  for (auto &i : inst) {
    if (i == nullptr) {
      o << "!!!nullptr!!!" << std::endl;
      continue;
    } else if (dynamic_cast<LabelInst *>(&*i) == nullptr) {
      o << "\t";
    }
    o << *i << std::endl;
  }
  o << "\t.fnend" << std::endl;
}